

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv__setsockopt_maybe_char(uv_udp_t *handle,int option4,int option6,int val)

{
  int iVar1;
  int *piVar2;
  int arg;
  
  if ((uint)val < 0x100) {
    if ((handle->flags & 0x10000) == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = 0x29;
      option4 = option6;
    }
    iVar1 = setsockopt((handle->io_watcher).fd,iVar1,option4,&arg,4);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      piVar2 = __errno_location();
      iVar1 = -*piVar2;
    }
  }
  else {
    iVar1 = -0x16;
  }
  return iVar1;
}

Assistant:

static int uv__setsockopt_maybe_char(uv_udp_t* handle,
                                     int option4,
                                     int option6,
                                     int val) {
#if defined(__sun) || defined(_AIX) || defined(__MVS__)
  char arg = val;
#elif defined(__OpenBSD__)
  unsigned char arg = val;
#else
  int arg = val;
#endif

  if (val < 0 || val > 255)
    return -EINVAL;

  return uv__setsockopt(handle, option4, option6, &arg, sizeof(arg));
}